

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  int unaff_EBP;
  uint uVar13;
  long lVar14;
  float fVar15;
  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  int iStack_10920;
  int iStack_1091c;
  int iStack_10918;
  int iStack_10914;
  EXRVersion EStack_108fc;
  EXRImage EStack_108e8;
  EXRHeader EStack_108c0;
  
  if (out_rgba == (float **)0x0) {
    iVar7 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar10 = "Invalid argument.\n";
  }
  else {
    bVar4 = false;
    memset(&EStack_108c0,0,0x10890);
    EStack_108e8.tiles = (EXRTile *)0x0;
    EStack_108e8.images._0_4_ = 0;
    EStack_108e8.images._4_4_ = 0;
    EStack_108e8.width = 0;
    EStack_108e8.height = 0;
    EStack_108e8.num_channels = 0;
    iVar7 = ParseEXRVersionFromFile(&EStack_108fc,filename);
    if (iVar7 == 0) {
      if (EStack_108fc.non_image == 0 && EStack_108fc.multipart == 0) {
        bVar4 = true;
        iVar7 = unaff_EBP;
      }
      else {
        if (err != (char **)0x0) {
          *err = "Loading multipart or DeepImage is not supported yet.\n";
        }
        bVar4 = false;
        iVar7 = -4;
      }
    }
    if (!bVar4) {
      return iVar7;
    }
    iVar7 = ParseEXRHeaderFromFile(&EStack_108c0,&EStack_108fc,filename,err);
    if (iVar7 != 0) {
      return iVar7;
    }
    if (0 < EStack_108c0.num_channels) {
      lVar11 = 0;
      do {
        if (EStack_108c0.pixel_types[lVar11] == 1) {
          EStack_108c0.requested_pixel_types[lVar11] = 2;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < EStack_108c0.num_channels);
    }
    iVar7 = LoadEXRImageFromFile(&EStack_108e8,&EStack_108c0,filename,err);
    if (iVar7 != 0) {
      return iVar7;
    }
    if ((long)EStack_108c0.num_channels < 1) {
      iStack_1091c = -1;
      iStack_10920 = -1;
      iStack_10914 = -1;
      iStack_10918 = -1;
    }
    else {
      iStack_10918 = -1;
      lVar11 = 0;
      iStack_10914 = -1;
      iStack_10920 = -1;
      iStack_1091c = -1;
      do {
        iVar8 = strcmp((EStack_108c0.channels)->name,"R");
        iVar12 = (int)lVar11;
        iVar7 = iStack_10920;
        iVar5 = iVar12;
        iVar6 = iStack_10914;
        if ((((iVar8 != 0) &&
             (iVar8 = strcmp((EStack_108c0.channels)->name,"G"), iVar7 = iVar12,
             iVar5 = iStack_1091c, iVar8 != 0)) &&
            (iVar8 = strcmp((EStack_108c0.channels)->name,"B"), iVar7 = iStack_10920, iVar6 = iVar12
            , iVar8 != 0)) &&
           (iVar8 = strcmp((EStack_108c0.channels)->name,"A"), iVar6 = iStack_10914, iVar8 == 0)) {
          iStack_10918 = iVar12;
        }
        iStack_10914 = iVar6;
        iStack_1091c = iVar5;
        iStack_10920 = iVar7;
        lVar11 = lVar11 + 1;
        EStack_108c0.channels = EStack_108c0.channels + 1;
      } while (EStack_108c0.num_channels != lVar11);
    }
    iVar7 = EStack_108e8.width;
    if (iStack_1091c == -1) {
      iVar7 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar10 = "R channel not found\n";
    }
    else if (iStack_10920 == -1) {
      iVar7 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar10 = "G channel not found\n";
    }
    else {
      if (iStack_10914 != -1) {
        iVar5 = EStack_108e8.height;
        pfVar9 = (float *)malloc((long)EStack_108e8.width * (long)EStack_108e8.height * 0x10);
        *out_rgba = pfVar9;
        uVar13 = iVar5 * iVar7;
        if (0 < (int)uVar13) {
          lVar3 = CONCAT44(EStack_108e8.images._4_4_,EStack_108e8.images._0_4_);
          lVar11 = *(long *)(lVar3 + (long)iStack_1091c * 8);
          lVar1 = *(long *)(lVar3 + (long)iStack_10920 * 8);
          lVar2 = *(long *)(lVar3 + (long)iStack_10914 * 8);
          lVar14 = 0;
          do {
            pfVar9[lVar14] = *(float *)(lVar11 + lVar14);
            pfVar9[lVar14 + 1] = *(float *)(lVar1 + lVar14);
            pfVar9[lVar14 + 2] = *(float *)(lVar2 + lVar14);
            fVar15 = 1.0;
            if (iStack_10918 != -1) {
              fVar15 = *(float *)(*(long *)(lVar3 + (long)iStack_10918 * 8) + lVar14);
            }
            pfVar9[lVar14 + 3] = fVar15;
            lVar14 = lVar14 + 4;
          } while ((ulong)uVar13 << 2 != lVar14);
        }
        *width = iVar7;
        *height = iVar5;
        FreeEXRHeader(&EStack_108c0);
        return 0;
      }
      iVar7 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar10 = "B channel not found\n";
    }
  }
  *err = pcVar10;
  return iVar7;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {
  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      if (err) {
        (*err) = "Loading multipart or DeepImage is not supported yet.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  (*out_rgba) = reinterpret_cast<float *>(
      malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
             static_cast<size_t>(exr_image.height)));
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exr_image.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exr_image.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA != -1) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);

  return TINYEXR_SUCCESS;
}